

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::decode_url
                   (string *__return_storage_ptr__,string *s,bool convert_plus_to_space)

{
  char cVar1;
  pointer pcVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  char buff [4];
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = s->_M_string_length;
  if (uVar5 != 0) {
    uVar10 = 0;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar7 = (char)__return_storage_ptr__;
      if ((pcVar2[uVar10] == '%') && (uVar10 + 1 < uVar5)) {
        if (pcVar2[uVar10 + 1] == 'u') {
          uVar4 = 0;
          bVar11 = false;
          if (uVar10 + 2 < uVar5) {
            lVar6 = 0;
            uVar4 = 0;
            do {
              cVar1 = pcVar2[lVar6 + uVar10 + 2];
              iVar8 = (int)cVar1;
              if (cVar1 == '\0') {
LAB_00114e04:
                bVar11 = false;
                goto LAB_00114e06;
              }
              uVar9 = iVar8 - 0x30;
              bVar11 = true;
              if (cVar1 < ' ' || 9 < uVar9) {
                if ((byte)(cVar1 + 0xbfU) < 6) {
                  uVar9 = iVar8 - 0x37;
                }
                else {
                  uVar9 = iVar8 - 0x57;
                  bVar11 = (byte)(cVar1 + 0x9fU) < 6;
                  if (!bVar11) {
                    uVar9 = 0;
                  }
                }
              }
              if (!bVar11) goto LAB_00114e04;
              uVar4 = uVar4 * 0x10 + uVar9;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            bVar11 = true;
          }
LAB_00114e06:
          if (bVar11) {
            bVar3 = (byte)uVar4;
            if ((int)uVar4 < 0x80) {
              local_3c = bVar3 & 0x7f;
LAB_00114e85:
              bVar11 = false;
            }
            else {
              if ((int)uVar4 < 0x800) {
                local_3c = (byte)(uVar4 >> 6) & 0x1f | 0xc0;
                local_3b = bVar3 & 0x3f | 0x80;
                goto LAB_00114e85;
              }
              if ((int)uVar4 < 0xd800) {
LAB_00114e5c:
                local_3c = (byte)(uVar4 >> 0xc) & 0xf | 0xe0;
                local_3b = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                local_3a = bVar3 & 0x3f | 0x80;
                goto LAB_00114e85;
              }
              bVar11 = true;
              if (0xdfff < (int)uVar4) {
                if ((int)uVar4 < 0x10000) goto LAB_00114e5c;
                if ((int)uVar4 < 0x110000) {
                  local_3c = (byte)(uVar4 >> 0x12) & 7 | 0xf0;
                  local_3b = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
                  local_3a = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                  local_39 = bVar3 & 0x3f | 0x80;
                  goto LAB_00114e85;
                }
              }
            }
            if (!bVar11) {
              std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_3c);
            }
            uVar10 = uVar10 + 5;
          }
          else {
            std::__cxx11::string::push_back(cVar7);
          }
        }
        else {
          lVar6 = 0;
          do {
            cVar1 = pcVar2[lVar6 + uVar10 + 1];
            if (cVar1 == '\0') {
LAB_00114dda:
              bVar11 = false;
              goto LAB_00114ddc;
            }
            bVar11 = true;
            if ((cVar1 < ' ' || 9 < (int)cVar1 - 0x30U) && (5 < (byte)(cVar1 + 0xbfU))) {
              bVar11 = (byte)(cVar1 + 0x9fU) < 6;
            }
            if (!bVar11) goto LAB_00114dda;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 2);
          bVar11 = true;
LAB_00114ddc:
          if (bVar11) {
            std::__cxx11::string::push_back(cVar7);
            uVar10 = uVar10 + 2;
          }
          else {
            std::__cxx11::string::push_back(cVar7);
          }
        }
      }
      else {
        std::__cxx11::string::push_back(cVar7);
      }
      uVar10 = uVar10 + 1;
      uVar5 = s->_M_string_length;
    } while (uVar10 < uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string &s,
									  bool convert_plus_to_space) {
			std::string result;

			for (size_t i = 0; i < s.size(); i++) {
				if (s[i] == '%' && i + 1 < s.size()) {
					if (s[i + 1] == 'u') {
						int val = 0;
						if (from_hex_to_i(s, i + 2, 4, val)) {
							// 4 digits Unicode codes
							char buff[4];
							size_t len = to_utf8(val, buff);
							if (len > 0) { result.append(buff, len); }
							i += 5; // 'u0000'
						} else {
							result += s[i];
						}
					} else {
						int val = 0;
						if (from_hex_to_i(s, i + 1, 2, val)) {
							// 2 digits hex codes
							result += static_cast<char>(val);
							i += 2; // '00'
						} else {
							result += s[i];
						}
					}
				} else if (convert_plus_to_space && s[i] == '+') {
					result += ' ';
				} else {
					result += s[i];
				}
			}

			return result;
		}